

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitLdArrayBuffer(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  OpCode OVar1;
  ViewType viewType;
  ParseNode *this_00;
  ParseNode *indexNode;
  code *pcVar2;
  EmitExpressionInfo EVar3;
  bool bVar4;
  Types type;
  EmitInfoBase value;
  ParseNodeBin *pPVar5;
  IdentPtr name;
  AsmJsSymbol *sym;
  AsmJsArrayView *pAVar6;
  undefined4 *puVar7;
  RegisterSpace *this_01;
  AsmJsCompilationException *this_02;
  TypedRegisterAllocator *this_03;
  EmitExpressionInfo local_48;
  EmitExpressionInfo indexInfo;
  uint32 indexSlot;
  EmitExpressionInfo info;
  OpCodeAsmJs op;
  
  pPVar5 = ParseNode::AsParseNodeBin(pnode);
  this_00 = pPVar5->pnode1;
  pPVar5 = ParseNode::AsParseNodeBin(pnode);
  indexNode = pPVar5->pnode2;
  OVar1 = this_00->nop;
  if ((OVar1 == knopName) || (OVar1 == knopStr)) {
    name = ParseNode::name(this_00);
    sym = AsmJsModuleCompiler::LookupIdentifier(this->mCompiler,name,this->mFunction,(Source *)0x0);
    if ((sym != (AsmJsSymbol *)0x0) && (sym->mType == ArrayView)) {
      pAVar6 = AsmJsArrayView::FromSymbol(sym);
      viewType = (pAVar6->super_AsmJsSymbol).field_0x14;
      indexInfo.type.which_ = Int;
      local_48 = EmitTypedArrayIndex(this,indexNode,(OpCodeAsmJs *)((long)&info.type.which_ + 2),
                                     &indexInfo.type.which_,viewType,LoadTypedArray);
      AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_48);
      indexSlot = (**(pAVar6->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar6);
      bVar4 = AsmJsType::isIntish((AsmJsType *)&indexSlot);
      if (bVar4) {
        this_03 = &this->mFunction->mTypedRegisterAllocator;
        type = WAsmJs::FromPrimitiveType<int>();
      }
      else {
        bVar4 = AsmJsType::isMaybeFloat((AsmJsType *)&indexSlot);
        if (bVar4) {
          this_03 = &this->mFunction->mTypedRegisterAllocator;
          type = WAsmJs::FromPrimitiveType<float>();
        }
        else {
          bVar4 = AsmJsType::isMaybeDouble((AsmJsType *)&indexSlot);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                        ,0x696,"(info.type.isMaybeDouble())",
                                        "info.type.isMaybeDouble()");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar7 = 0;
          }
          this_03 = &this->mFunction->mTypedRegisterAllocator;
          type = WAsmJs::FromPrimitiveType<double>();
        }
      }
      this_01 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_03,type);
      value.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_01);
      AsmJsByteCodeWriter::AsmTypedArr
                (&this->mWriter,info.type.which_._2_2_,value.location,indexInfo.type.which_,viewType
                );
      EVar3.type.which_ = indexSlot;
      EVar3.super_EmitInfoBase.location = value.location;
      return EVar3;
    }
    this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_02,L"Invalid identifier %s",&name->field_0x22);
  }
  else {
    this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException(this_02,L"Invalid symbol ");
  }
  __cxa_throw(this_02,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitLdArrayBuffer( ParseNode * pnode )
    {
        ParseNode* arrayNameNode = ParserWrapper::GetBinaryLeft( pnode );
        ParseNode* indexNode = ParserWrapper::GetBinaryRight( pnode );
        if( !ParserWrapper::IsNameDeclaration( arrayNameNode ) )
        {
            throw AsmJsCompilationException( _u("Invalid symbol ") );
        }

        PropertyName name = arrayNameNode->name();
        AsmJsSymbol* sym = mCompiler->LookupIdentifier(name, mFunction);
        if(!AsmJsArrayView::Is(sym))
        {
            throw AsmJsCompilationException( _u("Invalid identifier %s"), name->Psz() );
        }
        AsmJsArrayView* arrayView = AsmJsArrayView::FromSymbol(sym);
        ArrayBufferView::ViewType viewType = arrayView->GetViewType();

        OpCodeAsmJs op;
        uint32 indexSlot = 0;
        EmitExpressionInfo indexInfo = EmitTypedArrayIndex(indexNode, op, indexSlot, viewType, LoadTypedArray);
        mFunction->ReleaseLocationGeneric(&indexInfo);

        EmitExpressionInfo info( arrayView->GetType() );
        if( info.type.isIntish() )
        {
            info.location = mFunction->AcquireTmpRegister<int>();
        }
        else if (info.type.isMaybeFloat())
        {
            info.location = mFunction->AcquireTmpRegister<float>();
        }
        else
        {
            Assert(info.type.isMaybeDouble());
            info.location = mFunction->AcquireTmpRegister<double>();
        }
        mWriter.AsmTypedArr( op, info.location, indexSlot, viewType );

        return info;
    }